

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void sglr::clearToTextureInitialValue(PixelBufferAccess *access)

{
  TextureFormat *pTVar1;
  byte local_32;
  bool local_31;
  bool local_25;
  Vector<float,_4> local_24;
  byte local_13;
  bool local_12;
  bool local_11;
  bool hasColor;
  bool hasStencil;
  PixelBufferAccess *pPStack_10;
  bool hasDepth;
  PixelBufferAccess *access_local;
  
  pPStack_10 = access;
  pTVar1 = tcu::ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  local_25 = true;
  if (pTVar1->order != D) {
    pTVar1 = tcu::ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
    local_25 = pTVar1->order == DS;
  }
  local_11 = local_25;
  pTVar1 = tcu::ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
  local_31 = true;
  if (pTVar1->order != S) {
    pTVar1 = tcu::ConstPixelBufferAccess::getFormat(&access->super_ConstPixelBufferAccess);
    local_31 = pTVar1->order == DS;
  }
  local_12 = local_31;
  local_32 = 0;
  if ((local_11 & 1U) == 0) {
    local_32 = local_31 ^ 0xff;
  }
  local_13 = local_32 & 1;
  if ((local_11 & 1U) != 0) {
    tcu::clearDepth(access,0.0);
  }
  if ((local_12 & 1U) != 0) {
    tcu::clearStencil(access,0);
  }
  if ((local_13 & 1) != 0) {
    tcu::Vector<float,_4>::Vector(&local_24,0.0,0.0,0.0,1.0);
    tcu::clear(access,&local_24);
  }
  return;
}

Assistant:

static void clearToTextureInitialValue (PixelBufferAccess access)
{
	const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::D || access.getFormat().order == tcu::TextureFormat::DS;
	const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::S || access.getFormat().order == tcu::TextureFormat::DS;
	const bool hasColor		= !hasDepth && !hasStencil;

	if (hasDepth)
		tcu::clearDepth(access, 0.0f);
	if (hasStencil)
		tcu::clearStencil(access, 0u);
	if (hasColor)
		tcu::clear(access, Vec4(0.0f, 0.0f, 0.0f, 1.0f));
}